

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2centroids.cc
# Opt level: O2

S2Point * S2::TrueCentroid(S2Point *__return_storage_ptr__,S2Point *a,S2Point *b)

{
  double dVar1;
  double dVar2;
  double local_48;
  double dStack_40;
  double local_38;
  double local_28;
  double dStack_20;
  double local_18;
  
  local_18 = a->c_[2] - b->c_[2];
  local_28 = a->c_[0] - b->c_[0];
  dStack_20 = a->c_[1] - b->c_[1];
  local_38 = a->c_[2] + b->c_[2];
  local_48 = a->c_[0] + b->c_[0];
  dStack_40 = a->c_[1] + b->c_[1];
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_28);
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_48);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar1 = dVar1 / dVar2;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    __return_storage_ptr__->c_[0] = dVar1 * local_48;
    __return_storage_ptr__->c_[1] = dVar1 * dStack_40;
    __return_storage_ptr__->c_[2] = local_38 * dVar1;
  }
  else {
    __return_storage_ptr__->c_[0] = 0.0;
    __return_storage_ptr__->c_[1] = 0.0;
    __return_storage_ptr__->c_[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point TrueCentroid(const S2Point& a, const S2Point& b) {
  // The centroid (multiplied by length) is a vector toward the midpoint
  // of the edge, whose length is twice the sine of half the angle between
  // the two vertices.  Defining theta to be this angle, we have:
  S2Point vdiff = a - b;  // Length == 2*sin(theta)
  S2Point vsum = a + b;   // Length == 2*cos(theta)
  double sin2 = vdiff.Norm2();
  double cos2 = vsum.Norm2();
  if (cos2 == 0) return S2Point();  // Ignore antipodal edges.
  return sqrt(sin2 / cos2) * vsum;  // Length == 2*sin(theta)
}